

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O2

Status __thiscall
sentencepiece::SentencePieceTrainer::PopulateNormalizerSpec
          (SentencePieceTrainer *this,NormalizerSpec *normalizer_spec,bool is_denormalizer)

{
  ostringstream *poVar1;
  char *pcVar2;
  undefined8 *puVar3;
  string *psVar4;
  string_view name;
  string_view filename;
  CharsMap chars_map;
  undefined1 local_1a0 [8];
  _Rb_tree_node_base local_198;
  size_t local_178;
  
  if (normalizer_spec == (NormalizerSpec *)0x0) {
    poVar1 = (ostringstream *)(local_1a0 + 8);
    local_1a0._0_4_ = 0xd;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"third_party/sentencepiece/src/sentencepiece_trainer.cc");
    std::operator<<((ostream *)poVar1,"(");
    std::ostream::operator<<(poVar1,0xee);
    std::operator<<((ostream *)poVar1,") [");
    std::operator<<((ostream *)poVar1,"normalizer_spec");
    std::operator<<((ostream *)poVar1,"] ");
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
  }
  else {
    puVar3 = (undefined8 *)
             ((ulong)(normalizer_spec->normalization_rule_tsv_).tagged_ptr_.ptr_ &
             0xfffffffffffffffe);
    pcVar2 = (char *)puVar3[1];
    if (pcVar2 == (char *)0x0) {
      if (!is_denormalizer) {
        if (*(long *)(((ulong)(normalizer_spec->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8)
            == 0) {
          NormalizerSpec::set_name(normalizer_spec,(anonymous_namespace)::kDefaultNormalizerName);
        }
        if (*(long *)(((ulong)(normalizer_spec->precompiled_charsmap_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8) == 0) {
          puVar3 = (undefined8 *)
                   ((ulong)(normalizer_spec->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
          psVar4 = (string *)*puVar3;
          pcVar2 = (char *)puVar3[1];
          NormalizerSpec::_internal_mutable_precompiled_charsmap_abi_cxx11_(normalizer_spec);
          name._M_str = pcVar2;
          name._M_len = (size_t)this;
          normalizer::Builder::GetPrecompiledCharsMap(name,psVar4);
          if (*(long *)this != 0) {
            return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                    )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                      )this;
          }
          util::Status::~Status((Status *)this);
        }
      }
LAB_002401c0:
      util::Status::Status((Status *)this);
      return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
              )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                )this;
    }
    if (*(long *)(((ulong)(normalizer_spec->precompiled_charsmap_).tagged_ptr_.ptr_ &
                  0xfffffffffffffffe) + 8) == 0) {
      local_198._M_left = (_Base_ptr)(local_1a0 + 8);
      local_198._M_color = _S_red;
      local_198._M_parent = (_Base_ptr)0x0;
      local_178 = 0;
      filename._M_str = pcVar2;
      filename._M_len = (size_t)this;
      local_198._M_right = local_198._M_left;
      normalizer::Builder::LoadCharsMap(filename,(CharsMap *)*puVar3);
      if (*(long *)this == 0) {
        util::Status::~Status((Status *)this);
        psVar4 = NormalizerSpec::_internal_mutable_precompiled_charsmap_abi_cxx11_(normalizer_spec);
        normalizer::Builder::CompileCharsMap((Builder *)this,(CharsMap *)local_1a0,psVar4);
        if (*(long *)this == 0) {
          util::Status::~Status((Status *)this);
          NormalizerSpec::set_name(normalizer_spec,"user_defined");
          std::
          _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                       *)local_1a0);
          goto LAB_002401c0;
        }
      }
      std::
      _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                   *)local_1a0);
      return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
              )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                )this;
    }
    poVar1 = (ostringstream *)(local_1a0 + 8);
    local_1a0._0_4_ = 0xd;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"third_party/sentencepiece/src/sentencepiece_trainer.cc");
    std::operator<<((ostream *)poVar1,"(");
    std::ostream::operator<<(poVar1,0xf1);
    std::operator<<((ostream *)poVar1,") [");
    std::operator<<((ostream *)poVar1,"normalizer_spec->precompiled_charsmap().empty()");
    std::operator<<((ostream *)poVar1,"] ");
    std::operator<<((ostream *)poVar1,"precompiled_charsmap is already defined.");
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a0 + 8));
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status SentencePieceTrainer::PopulateNormalizerSpec(
    NormalizerSpec *normalizer_spec, bool is_denormalizer) {
  CHECK_OR_RETURN(normalizer_spec);

  if (!normalizer_spec->normalization_rule_tsv().empty()) {
    CHECK_OR_RETURN(normalizer_spec->precompiled_charsmap().empty())
        << "precompiled_charsmap is already defined.";
    normalizer::Builder::CharsMap chars_map;
    RETURN_IF_ERROR(normalizer::Builder::LoadCharsMap(
        normalizer_spec->normalization_rule_tsv(), &chars_map));
    RETURN_IF_ERROR(normalizer::Builder::CompileCharsMap(
        chars_map, normalizer_spec->mutable_precompiled_charsmap()));
    normalizer_spec->set_name("user_defined");
  } else if (!is_denormalizer) {
    if (normalizer_spec->name().empty()) {
      normalizer_spec->set_name(kDefaultNormalizerName);
    }
    if (normalizer_spec->precompiled_charsmap().empty()) {
      RETURN_IF_ERROR(normalizer::Builder::GetPrecompiledCharsMap(
          normalizer_spec->name(),
          normalizer_spec->mutable_precompiled_charsmap()));
    }
  }

  return util::OkStatus();
}